

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTest.cpp
# Opt level: O3

void __thiscall BaseTest::solve<PrimMST<BinaryHeap,false>>(BaseTest *this,char *info)

{
  size_t sVar1;
  long lVar2;
  ostream *poVar3;
  long *plVar4;
  double dVar5;
  rep time;
  double ans;
  PrimMST<BinaryHeap,_false> solver;
  long local_48;
  double local_40;
  char *local_38;
  PrimMST<BinaryHeap,_false> local_30;
  
  local_38 = info;
  if (info == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1100e0);
  }
  else {
    sVar1 = strlen(info);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,info,sVar1);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x20);
  std::ostream::put(-0x20);
  std::ostream::flush();
  lVar2 = std::chrono::_V2::system_clock::now();
  std::vector<Point2d,_std::allocator<Point2d>_>::vector(&local_30.pts,&this->input);
  dVar5 = PrimMST<BinaryHeap,_false>::operator()(&local_30);
  local_40 = dVar5;
  local_48 = std::chrono::_V2::system_clock::now();
  local_48 = local_48 - lVar2;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"use time : ",0xb);
  poVar3 = std::ostream::_M_insert<long>((long)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"result : ",9);
  poVar3 = std::ostream::_M_insert<double>(dVar5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  plVar4 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
  std::ostream::put((char)plVar4);
  std::ostream::flush();
  std::vector<BaseTest::Result,std::allocator<BaseTest::Result>>::
  emplace_back<char_const*&,double&,long&>
            ((vector<BaseTest::Result,std::allocator<BaseTest::Result>> *)&this->results,&local_38,
             &local_40,&local_48);
  if (local_30.pts.super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.pts.super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.pts.super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl
                          .super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.pts.super__Vector_base<Point2d,_std::allocator<Point2d>_>._M_impl
                          .super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void BaseTest::solve(const char *info)
{
	std::cout << info << std::endl;
	auto beg = now();
	MSTSolver solver(input);
	double ans = solver();
	auto time = (now() - beg).count();
	std::cout << "use time : " << time << std::endl
	          << "result : " << ans << std::endl
	          << std::endl;
	results.emplace_back(info, ans, time);
}